

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O2

void Abc_SuppGenSelectVar(Vec_Wrd_t *p,int nBits,int iVar)

{
  ulong *puVar1;
  ulong *puVar2;
  
  puVar2 = p->pArray;
  puVar1 = puVar2 + p->nSize;
  for (; puVar2 < puVar1; puVar2 = puVar2 + 1) {
    if ((*puVar2 & 1L << ((byte)iVar & 0x3f)) != 0) {
      *puVar2 = *puVar2 ^ 1L << ((byte)nBits & 0x3f);
    }
  }
  return;
}

Assistant:

void Abc_SuppGenSelectVar( Vec_Wrd_t * p, int nBits, int iVar )
{
    word * pEntry = Vec_WrdArray(p);
    word * pLimit = Vec_WrdLimit(p);
    for ( ; pEntry < pLimit; pEntry++ )
        if ( (*pEntry >> iVar) & 1 )
            *pEntry ^= (((word)1) << nBits);
}